

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall
bloaty::ArgParser::TryParseUint64Option(ArgParser *this,string_view flag,uint64_t *val)

{
  bool bVar1;
  unsigned_long_long uVar2;
  string_view val_str;
  string local_a0 [2];
  allocator<char> local_50 [48];
  
  val_str._M_len = 0;
  val_str._M_str = (char *)0x0;
  bVar1 = TryParseOption(this,flag,&val_str);
  if (bVar1) {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)local_a0,&val_str,local_50);
    uVar2 = std::__cxx11::stoull(local_a0,(size_t *)0x0,0);
    *val = uVar2;
    std::__cxx11::string::~string((string *)local_a0);
  }
  return bVar1;
}

Assistant:

bool TryParseUint64Option(string_view flag, uint64_t* val) {
    string_view val_str;
    if (!TryParseOption(flag, &val_str)) {
      return false;
    }

    try {
      *val = std::stoull(std::string(val_str), nullptr, 0);
    } catch (...) {
      THROWF("option '$0' had non-integral argument: $1", flag, val_str);
    }

    return true;
  }